

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void matrix_print(gf *a,int m,int n)

{
  ulong uVar1;
  ulong uVar2;
  
  if (0 < m) {
    uVar1 = 0;
    do {
      if (0 < n) {
        uVar2 = 0;
        do {
          fprintf(_stderr,"%-3u ",(ulong)a[uVar2]);
          uVar2 = uVar2 + 1;
        } while ((uint)n != uVar2);
      }
      fputc(10,_stderr);
      uVar1 = uVar1 + 1;
      a = a + (uint)n;
    } while (uVar1 != (uint)m);
  }
  return;
}

Assistant:

void matrix_print(gf *a, int m, int n) {
  int row;
  for (row = 0; row < m; row++) {
    int col;
    for (col = 0; col < n; col++)
      fprintf(stderr, "%-3u ", a[row * n + col]);
    fprintf(stderr, "\n");
  }
}